

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

unordered_map<kratos::Var_*,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>_>
* kratos::find_driver_signal
            (unordered_map<kratos::Var_*,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>_>
             *__return_storage_ptr__,Generator *top)

{
  unordered_map<kratos::Var_*,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>_>
  *puVar1;
  undefined1 local_98 [8];
  VarSourceVisitor visitor;
  Generator *top_local;
  
  visitor.map_._M_h._M_single_bucket = (__node_base_ptr)top;
  VarSourceVisitor::VarSourceVisitor((VarSourceVisitor *)local_98);
  IRVisitor::visit_root((IRVisitor *)local_98,(IRNode *)visitor.map_._M_h._M_single_bucket);
  puVar1 = VarSourceVisitor::map((VarSourceVisitor *)local_98);
  std::
  unordered_map<kratos::Var_*,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>_>
  ::unordered_map(__return_storage_ptr__,puVar1);
  VarSourceVisitor::~VarSourceVisitor((VarSourceVisitor *)local_98);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<Var *, std::unordered_set<Var *>> find_driver_signal(Generator *top) {
    VarSourceVisitor visitor;
    visitor.visit_root(top);
    return visitor.map();
}